

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void defaultPanic(TidyAllocator *allocator,ctmbstr msg)

{
  undefined8 *puVar1;
  undefined8 extraout_RDX;
  ctmbstr ptVar2;
  
  if (g_panic == (TidyPanic)0x0) {
    ptVar2 = msg;
    defaultPanic_cold_1();
    puVar1 = (undefined8 *)(*(code *)**(undefined8 **)ptVar2)();
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[1] = ptVar2;
      *puVar1 = extraout_RDX;
      *(code **)((long)msg + 8) = filesrc_getByte;
      *(code **)((long)msg + 0x18) = filesrc_eof;
      *(code **)((long)msg + 0x10) = filesrc_ungetByte;
      *(undefined8 **)msg = puVar1;
    }
    return;
  }
  (*g_panic)(msg);
  return;
}

Assistant:

static void TIDY_CALL defaultPanic( TidyAllocator* ARG_UNUSED(allocator), ctmbstr msg )
{
  if ( g_panic )
    g_panic( msg );
  else
  {
    /* 2 signifies a serious error */
    fprintf( stderr, "Fatal error: %s\n", msg );
#ifdef _DEBUG
    assert(0);
#endif
    exit(2);
  }
}